

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O2

Tcl_HashEntry * ArrayCreate(Tcl_HashTable *tablePtr,char *key,int *newPtr)

{
  Tcl_HashEntry *pTVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  Tcl_HashEntry *pTVar6;
  
  iVar2 = 0;
  piVar4 = (int *)key;
  for (iVar5 = tablePtr->keyType; 0 < iVar5; iVar5 = iVar5 + -1) {
    iVar2 = iVar2 + *piVar4;
    piVar4 = piVar4 + 1;
  }
  pTVar6 = (Tcl_HashEntry *)
           (tablePtr->buckets +
           (int)((uint)((long)iVar2 * 0x41c64e6d >> ((byte)tablePtr->downShift & 0x3f)) &
                tablePtr->mask));
  pTVar1 = pTVar6;
  do {
    pTVar1 = pTVar1->nextPtr;
    if (pTVar1 == (Tcl_HashEntry *)0x0) {
      *newPtr = 1;
      iVar5 = tablePtr->keyType;
      pTVar1 = (Tcl_HashEntry *)malloc((ulong)(iVar5 * 4 + 0x24));
      pTVar1->tablePtr = tablePtr;
      pTVar1->bucketPtr = (Tcl_HashEntry **)pTVar6;
      pTVar1->nextPtr = pTVar6->nextPtr;
      pTVar1->clientData = (ClientData)0x0;
      lVar3 = 0x20;
      for (; 0 < iVar5; iVar5 = iVar5 + -1) {
        *(undefined4 *)((long)&pTVar1->nextPtr + lVar3) = *(undefined4 *)(key + lVar3 + -0x20);
        lVar3 = lVar3 + 4;
      }
      pTVar6->nextPtr = pTVar1;
      iVar5 = tablePtr->numEntries + 1;
      tablePtr->numEntries = iVar5;
      if (tablePtr->rebuildSize <= iVar5) {
        RebuildTable(tablePtr);
      }
      return pTVar1;
    }
    lVar3 = 0;
    while( true ) {
      if (tablePtr->keyType == (int)lVar3) {
        *newPtr = 0;
        return pTVar1;
      }
      if (*(int *)(key + lVar3 * 4) != *(int *)((long)&pTVar1->key + lVar3 * 4)) break;
      lVar3 = lVar3 + 1;
    }
  } while( true );
}

Assistant:

static Tcl_HashEntry *
ArrayCreate(Tcl_HashTable *tablePtr, register char *key, int *newPtr)
{
    register Tcl_HashEntry *hPtr;
    int *arrayPtr = (int *) key;
    register int *iPtr1, *iPtr2;
    int index, count;

    for (index = 0, count = tablePtr->keyType, iPtr1 = arrayPtr;
	 count > 0; count--, iPtr1++) {
	index += *iPtr1;
    }
    index = RANDOM_INDEX(tablePtr, index);

    /* 
     * Search all of the entries in the appropriate bucket.
     */

    for (hPtr = tablePtr->buckets[index]; hPtr != NULL;
	 hPtr = hPtr->nextPtr) {
	for (iPtr1 = arrayPtr, iPtr2 = hPtr->key.words,
	     count = tablePtr->keyType;; count--, iPtr1++, iPtr2++) {
	    if (count == 0) {
		*newPtr = 0;
		return hPtr;
	    }
	    if (*iPtr1 != *iPtr2) {
		break;
	    }
	}
    }

    /* 
     * Entry not found.  Add a new one to the bucket.
     */

    *newPtr = 1;
    hPtr = (Tcl_HashEntry *) malloc((unsigned) (sizeof(Tcl_HashEntry)
			       + (tablePtr->keyType * sizeof(int)) - 4));
    hPtr->tablePtr = tablePtr;
    hPtr->bucketPtr = &(tablePtr->buckets[index]);
    hPtr->nextPtr = *hPtr->bucketPtr;
    hPtr->clientData = 0;
    for (iPtr1 = arrayPtr, iPtr2 = hPtr->key.words, count = tablePtr->keyType;
	 count > 0; count--, iPtr1++, iPtr2++) {
	*iPtr2 = *iPtr1;
    }
    *hPtr->bucketPtr = hPtr;
    tablePtr->numEntries++;

    /* 
     * If the table has exceeded a decent size, rebuild it with many
     * more buckets.
     */

    if (tablePtr->numEntries >= tablePtr->rebuildSize) {
	RebuildTable(tablePtr);
    }
    return hPtr;
}